

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int __pid;
  int iVar1;
  __pid_t _Var2;
  ssize_t sVar3;
  char *__s;
  utsname uts;
  char link [1025];
  utsname local_59e;
  char local_418 [1032];
  
  if (argc < 2) {
    fprintf(_stderr,"Usage: %s <child-hostname>\n",*argv);
  }
  else {
    __pid = clone(childFunc,&_end,0x4000011,argv[1]);
    if (__pid == -1) {
      __s = "clone";
    }
    else {
      printf("PID of child created by clone() is %ld\n",(long)__pid);
      sleep(1);
      iVar1 = uname(&local_59e);
      if (iVar1 == -1) {
        __s = "uname";
      }
      else {
        printf("uts.nodename in parent: %s\n");
        printf("uts namespace for parent: ");
        memset(local_418,0,0x401);
        sVar3 = readlink("/proc/self/ns/uts",local_418,0x400);
        if (sVar3 == -1) {
          __s = "readlink";
        }
        else {
          printf("%s -> %s\n","/proc/self/ns/uts",local_418);
          _Var2 = waitpid(__pid,(int *)0x0,0);
          if (_Var2 != -1) {
            puts("child has terminated");
            exit(0);
          }
          __s = "waitpid";
        }
      }
    }
    perror(__s);
  }
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    pid_t child_pid;
    struct utsname uts;

    if (argc < 2) {
        fprintf(stderr, "Usage: %s <child-hostname>\n", argv[0]);
        exit(EXIT_FAILURE);
    }

    /* Create a child that has its own UTS namespace;
       the child commences execution in childFunc() */

    child_pid = clone(childFunc,
                      child_stack + STACK_SIZE,   /* Points to start of
                                                     downwardly growing stack */
                      CLONE_NEWUTS | SIGCHLD, argv[1]);
    if (child_pid == -1)
        errExit("clone");
    printf("PID of child created by clone() is %ld\n", (long) child_pid);

    /* Parent falls through to here */

    sleep(1);           /* Give child time to change its hostname */

    /* Display the hostname in parent's UTS namespace. This will be
       different from the hostname in child's UTS namespace. */

    if (uname(&uts) == -1)
        errExit("uname");
    printf("uts.nodename in parent: %s\n", uts.nodename);
    printf("uts namespace for parent: ");
    print_link("/proc/self/ns/uts");

    if (waitpid(child_pid, NULL, 0) == -1)      /* Wait for child */
        errExit("waitpid");
    printf("child has terminated\n");

    exit(EXIT_SUCCESS);
}